

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactWrench.cpp
# Opt level: O2

bool __thiscall
iDynTree::LinkContactWrenches::computeNetWrenches
          (LinkContactWrenches *this,LinkNetExternalWrenches *netWrenches)

{
  pointer pvVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t nrOfLinks;
  Wrench *pWVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  SpatialForceVector local_110 [56];
  Wrench link_wrench_due_to_contact;
  Transform link_H_contact;
  
  sVar3 = LinkWrenches::getNrOfLinks(netWrenches);
  sVar4 = LinkWrenches::getNrOfLinks(netWrenches);
  nrOfLinks = ((long)(this->m_linkContactWrenches).
                     super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_linkContactWrenches).
                    super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (sVar4 != nrOfLinks) {
    LinkWrenches::resize(netWrenches,nrOfLinks);
  }
  sVar4 = 0;
  if ((long)sVar3 < 1) {
    sVar3 = sVar4;
  }
  for (; sVar4 != sVar3; sVar4 = sVar4 + 1) {
    pWVar5 = LinkWrenches::operator()(netWrenches,sVar4);
    SpatialVector<iDynTree::SpatialForceVector>::zero
              ((SpatialVector<iDynTree::SpatialForceVector> *)&pWVar5->field_0x8);
    pvVar1 = (this->m_linkContactWrenches).
             super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = ((long)*(pointer *)
                    ((long)&pvVar1[sVar4].
                            super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                            ._M_impl + 8) -
            *(long *)&pvVar1[sVar4].
                      super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                      ._M_impl) / 0x58;
    lVar7 = 0x18;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      lVar2 = *(long *)&(this->m_linkContactWrenches).
                        super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar4].
                        super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                        ._M_impl;
      iDynTree::Rotation::Identity();
      iDynTree::Transform::Transform
                (&link_H_contact,(Rotation *)&link_wrench_due_to_contact,
                 (Position *)(lVar7 + lVar2 + -0x18));
      iDynTree::Transform::operator*
                ((Transform *)&link_wrench_due_to_contact,(Wrench *)&link_H_contact);
      pWVar5 = LinkWrenches::operator()(netWrenches,sVar4);
      iDynTree::Wrench::operator+((Wrench *)local_110,pWVar5);
      pWVar5 = LinkWrenches::operator()(netWrenches,sVar4);
      iDynTree::Wrench::operator=(pWVar5,(Wrench *)local_110);
      iDynTree::SpatialForceVector::~SpatialForceVector(local_110);
      iDynTree::SpatialForceVector::~SpatialForceVector
                ((SpatialForceVector *)&link_wrench_due_to_contact);
      lVar7 = lVar7 + 0x58;
    }
  }
  return true;
}

Assistant:

bool LinkContactWrenches::computeNetWrenches(LinkNetExternalWrenches& netWrenches) const
{
    // Resize the output if necessary
    size_t nrOfLinks =  netWrenches.getNrOfLinks();
    if( netWrenches.getNrOfLinks() != m_linkContactWrenches.size() )
    {
        netWrenches.resize(m_linkContactWrenches.size());
    }

    for(LinkIndex l=0; l < static_cast<LinkIndex>(nrOfLinks); l++)
    {
        netWrenches(l).zero();

        // sum all the contact wrenches
        size_t nrOfContacts = this->getNrOfContactsForLink(l);
        for(size_t c=0; c < nrOfContacts; c++)
        {
            // Each contact wrench is expressed with respect to the contact point
            // and with the orientation of the link frame, so we need to translate it
            // to the link frame
            const ContactWrench & contact = this->contactWrench(l,c);

            Transform link_H_contact(Rotation::Identity(),contact.contactPoint());

            Wrench link_wrench_due_to_contact = link_H_contact*contact.contactWrench();

            netWrenches(l) = netWrenches(l) + link_wrench_due_to_contact;
        }
    }

    return true;
}